

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

bool __thiscall
google::protobuf::internal::GeneratedExtensionFinder::Find
          (GeneratedExtensionFinder *this,int number,ExtensionInfo *output)

{
  bool bVar1;
  bool bVar2;
  undefined5 uVar3;
  ExtensionInfo *pEVar4;
  ExtensionInfo *extension;
  ExtensionInfo *output_local;
  int number_local;
  GeneratedExtensionFinder *this_local;
  
  pEVar4 = anon_unknown_0::FindRegisteredExtension(this->containing_type_,number);
  if (pEVar4 != (ExtensionInfo *)0x0) {
    bVar1 = pEVar4->is_repeated;
    bVar2 = pEVar4->is_packed;
    uVar3 = *(undefined5 *)&pEVar4->field_0x3;
    output->type = pEVar4->type;
    output->is_repeated = bVar1;
    output->is_packed = bVar2;
    *(undefined5 *)&output->field_0x3 = uVar3;
    (output->field_3).enum_validity_check.func = (pEVar4->field_3).enum_validity_check.func;
    (output->field_3).enum_validity_check.arg = (pEVar4->field_3).enum_validity_check.arg;
    output->descriptor = pEVar4->descriptor;
  }
  return pEVar4 != (ExtensionInfo *)0x0;
}

Assistant:

bool GeneratedExtensionFinder::Find(int number, ExtensionInfo* output) {
  const ExtensionInfo* extension =
      FindRegisteredExtension(containing_type_, number);
  if (extension == NULL) {
    return false;
  } else {
    *output = *extension;
    return true;
  }
}